

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_container.h
# Opt level: O2

mapped_type * __thiscall
gtl::internal_btree::
btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
::operator[](btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
             *this,key_type *key)

{
  pointer ppVar1;
  tuple<> local_29;
  _Head_base<0UL,_const_S2BooleanOperation::SourceId_&,_false> local_28;
  pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>,_bool>
  local_20;
  
  local_28._M_head_impl = key;
  btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
  ::
  insert_unique<std::piecewise_construct_t_const&,std::tuple<S2BooleanOperation::SourceId_const&>,std::tuple<>>
            (&local_20,
             (btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
              *)this,key,(piecewise_construct_t *)&std::piecewise_construct,
             (tuple<const_S2BooleanOperation::SourceId_&> *)&local_28,&local_29);
  ppVar1 = btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
           ::operator->(&local_20.first);
  return &ppVar1->second;
}

Assistant:

mapped_type &operator[](const key_type &key) {
    return this->tree_
        .insert_unique(key, std::piecewise_construct,
                       std::forward_as_tuple(key), std::forward_as_tuple())
        .first->second;
  }